

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoop.cpp
# Opt level: O2

void __thiscall EventLoop::runInLoop(EventLoop *this,Functor *cb)

{
  bool bVar1;
  
  bVar1 = isInLoopThread(this);
  if (bVar1) {
    std::function<void_()>::operator()(cb);
    return;
  }
  queueInLoop(this,cb);
  return;
}

Assistant:

void EventLoop::runInLoop(Functor&& cb){
    if(isInLoopThread()){
        cb();
    }else{
        queueInLoop(std::move(cb));
    }
}